

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

double __thiscall soplex::SLUFactor<double>::stability(SLUFactor<double> *this)

{
  double dVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[1])();
  dVar3 = 0.0;
  if (iVar2 == 0) {
    dVar3 = (this->super_CLUFactor<double>).initMaxabs;
    dVar1 = (this->super_CLUFactor<double>).maxabs;
    if (dVar3 <= dVar1) {
      dVar3 = dVar3 / dVar1;
    }
    else {
      dVar3 = 1.0;
    }
  }
  return dVar3;
}

Assistant:

R SLUFactor<R>::stability() const
{
   if(status() != this->OK)
      return 0;

   if(this->maxabs < this->initMaxabs)
      return 1;

   assert(this->maxabs != 0.0);
   return this->initMaxabs / this->maxabs;
}